

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char> __thiscall
fmt::v7::detail::write_bytes<char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,string_view bytes,basic_format_specs<char> *specs)

{
  byte bVar1;
  char *pcVar2;
  buffer_appender<char> bVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  buffer<char> *buf;
  ulong n;
  
  piVar4 = (int *)bytes.size_;
  pcVar5 = bytes.data_;
  pcVar2 = (char *)(long)*piVar4;
  if (-1 < (long)pcVar2) {
    uVar6 = 0;
    if (pcVar5 <= pcVar2) {
      uVar6 = (long)pcVar2 - (long)pcVar5;
    }
    bVar1 = *(byte *)((long)&basic_data<void>::left_padding_shifts +
                     (ulong)(*(byte *)((long)piVar4 + 9) & 0xf));
    if (*(char **)(this + 0x18) <
        pcVar5 + *(byte *)((long)piVar4 + 0xe) * uVar6 + *(long *)(this + 0x10)) {
      (*(code *)**(undefined8 **)this)(this);
    }
    n = uVar6 >> (bVar1 & 0x3f);
    bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                      ((buffer_appender<char>)this,n,(fill_t<char> *)((long)piVar4 + 10));
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      ((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container,
                       pcVar5 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container,bVar3);
    bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                      (bVar3,uVar6 - n,(fill_t<char> *)((long)piVar4 + 10));
    return (buffer_appender<char>)
           bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, F&& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}